

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum-dtoa.cc
# Opt level: O1

void TestBignumDtoaGayShortest(void)

{
  uint uVar1;
  char *__s1;
  int iVar2;
  PrecomputedShortest *pPVar3;
  long lVar4;
  Vector<const_double_conversion::PrecomputedShortest> VVar5;
  Vector<char> buffer;
  int point;
  int length;
  char buffer_container [100];
  int *in_stack_ffffffffffffff58;
  uint local_a0;
  undefined1 local_9c [4];
  char local_98 [104];
  
  VVar5 = double_conversion::PrecomputedShortestRepresentations();
  pPVar3 = VVar5.start_;
  if (0 < VVar5.length_) {
    lVar4 = 0;
    do {
      __s1 = *(char **)((long)&pPVar3->representation + lVar4);
      uVar1 = *(uint *)((long)&pPVar3->decimal_point + lVar4);
      buffer._8_8_ = local_9c;
      buffer.start_ = (char *)0x64;
      double_conversion::BignumDtoa
                ((double_conversion *)0x0,*(double *)((long)&pPVar3->v + lVar4),BIGNUM_DTOA_SHORTEST
                 ,(int)local_98,buffer,(int *)&local_a0,in_stack_ffffffffffffff58);
      if (uVar1 != local_a0) {
        printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-bignum-dtoa.cc"
               ,0x150,"current_test.decimal_point","point",(ulong)uVar1,
               CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),local_a0));
LAB_0082a2d9:
        abort();
      }
      if (__s1 == (char *)0x0) goto LAB_0082a2d9;
      iVar2 = strcmp(__s1,local_98);
      if (iVar2 != 0) {
        printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-bignum-dtoa.cc"
               ,0x151,"current_test.representation","buffer.start()",__s1,local_98);
        abort();
      }
      lVar4 = lVar4 + 0x18;
    } while ((VVar5._8_8_ & 0xffffffff) * 0x18 != lVar4);
  }
  return;
}

Assistant:

TEST(BignumDtoaGayShortest) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;

  Vector<const PrecomputedShortest> precomputed =
      PrecomputedShortestRepresentations();
  for (int i = 0; i < precomputed.length(); ++i) {
    const PrecomputedShortest current_test = precomputed[i];
    double v = current_test.v;
    BignumDtoa(v, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
    CHECK_EQ(current_test.decimal_point, point);
    CHECK_EQ(current_test.representation, buffer.start());
  }
}